

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall
Inject::context_nesting_override_binding::test_method(context_nesting_override_binding *this)

{
  int iVar1;
  service *psVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  injected<Inject::service> p_1;
  component<Inject::impl2> y;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  injected<Inject::service> p2;
  unique_id local_1d0;
  injected<Inject::service> p;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  unique_id local_188;
  context<0> c_1;
  provides<Inject::service> yy;
  provides<Inject::service> xxx;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  context<0> c;
  
  inject::context<0>::component<Inject::service>::component(&x);
  inject::context<0>::component<Inject::impl1>::component(&xx);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&xxx);
  inject::context<0>::component<Inject::impl2>::component(&y);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::provides(&yy);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_0015fda8;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl1,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::injected<Inject::service>::injected(&p);
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0xb4);
  c_1._bindings._M_t._M_impl._0_1_ = 0;
  c_1._vptr_context = (_func_int **)&PTR__lazy_ostream_0015fea8;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       &boost::unit_test::lazy_ostream::inst;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x14c75c;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_190 = "";
  psVar2 = inject::context<0>::injected<Inject::service>::operator->(&p);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  p2._ptr.px = (element_type *)CONCAT44(extraout_var,iVar1);
  p_1._ptr.px = (element_type *)inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&c_1,&local_198,0xb4,1,2,&p2,"p->id()",&p_1,"id_of<impl1>::id()");
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c_1._vptr_context = (_func_int **)&PTR__context_0015fda8;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c_1._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c_1;
  inject::context<0>::current()::_current = &c_1;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl2,(inject::component_scope)0>(&c_1);
  inject::context<0>::injected<Inject::service>::injected(&p_1);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0xba);
  p2._ptr.pn.pi_._0_1_ = 0;
  p2._ptr.px = (element_type *)&PTR__lazy_ostream_0015fea8;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_1a0 = "";
  psVar2 = inject::context<0>::injected<Inject::service>::operator->(&p_1);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_1d0 = CONCAT44(extraout_var_00,iVar1);
  local_188 = inject::id_of<Inject::impl2>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&p2,&local_1a8,0xba,1,2,&local_1d0,"p->id()",&local_188,"id_of<impl2>::id()");
  boost::detail::shared_count::~shared_count(&p_1._ptr.pn);
  inject::context<0>::~context(&c_1);
  inject::context<0>::injected<Inject::service>::injected(&p2);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0xbe);
  c_1._bindings._M_t._M_impl._0_1_ = 0;
  c_1._vptr_context = (_func_int **)&PTR__lazy_ostream_0015fea8;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       &boost::unit_test::lazy_ostream::inst;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x14c75c;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_1b0 = "";
  psVar2 = inject::context<0>::injected<Inject::service>::operator->(&p2);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  p_1._ptr.px = (element_type *)CONCAT44(extraout_var_01,iVar1);
  local_1d0 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&c_1,&local_1b8,0xbe,1,2,&p_1,"p2->id()",&local_1d0,"id_of<impl1>::id()");
  boost::detail::shared_count::~shared_count(&p2._ptr.pn);
  boost::detail::shared_count::~shared_count(&p._ptr.pn);
  inject::context<0>::~context(&c);
  inject::context<0>::component<Inject::impl2>::~component(&y);
  inject::context<0>::component<Inject::impl1>::~component(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(context_nesting_override_binding)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;
    context<>::component<impl2> y;
    context<>::component<impl2>::provides<service> yy;

    context<> c;
    c.bind<service, impl1>();
    context<>::injected<service> p;
    BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());

    {
        context<> c;
        c.bind<service, impl2>();
        context<>::injected<service> p;
        BOOST_CHECK_EQUAL(p->id(), id_of<impl2>::id());
    }
    
    context<>::injected<service> p2;
    BOOST_CHECK_EQUAL(p2->id(), id_of<impl1>::id());
}